

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall
helics::CommsInterface::setMessageSize(CommsInterface *this,int maxMsgSize,int maxCount)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  CommsInterface *in_RDI;
  
  bVar1 = propertyLock(in_RDI);
  if (bVar1) {
    if (0 < in_ESI) {
      in_RDI->maxMessageSize = in_ESI;
    }
    if (0 < in_EDX) {
      in_RDI->maxMessageCount = in_EDX;
    }
    propertyUnLock((CommsInterface *)CONCAT44(in_ESI,in_EDX));
  }
  return;
}

Assistant:

void CommsInterface::setMessageSize(int maxMsgSize, int maxCount)
{
    if (propertyLock()) {
        if (maxMsgSize > 0) {
            maxMessageSize = maxMsgSize;
        }
        if (maxCount > 0) {
            maxMessageCount = maxCount;
        }
        propertyUnLock();
    }
}